

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locdspnm.cpp
# Opt level: O3

UDisplayContext __thiscall
icu_63::LocaleDisplayNamesImpl::getContext(LocaleDisplayNamesImpl *this,UDisplayContextType type)

{
  UDisplayContext UVar1;
  
  if (type == UDISPCTX_TYPE_DISPLAY_LENGTH) {
    UVar1 = this->nameLength;
  }
  else {
    if (type == UDISPCTX_TYPE_CAPITALIZATION) {
      return this->capitalizationContext;
    }
    UVar1 = UDISPCTX_STANDARD_NAMES;
    if (type == UDISPCTX_TYPE_DIALECT_HANDLING) {
      return this->dialectHandling;
    }
  }
  return UVar1;
}

Assistant:

UDisplayContext
LocaleDisplayNamesImpl::getContext(UDisplayContextType type) const {
    switch (type) {
        case UDISPCTX_TYPE_DIALECT_HANDLING:
            return (UDisplayContext)dialectHandling;
        case UDISPCTX_TYPE_CAPITALIZATION:
            return capitalizationContext;
        case UDISPCTX_TYPE_DISPLAY_LENGTH:
            return nameLength;
        default:
            break;
    }
    return (UDisplayContext)0;
}